

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O3

void __thiscall
el::base::TypedConfigurations::TypedConfigurations
          (TypedConfigurations *this,TypedConfigurations *other)

{
  _Rb_tree_header *p_Var1;
  Configurations *configurations;
  
  (this->super_ThreadSafe)._vptr_ThreadSafe = (_func_int **)&PTR_acquireLock_001835c8;
  p_Var1 = &(this->m_enabledMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_enabledMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_enabledMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_enabledMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_enabledMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_enabledMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_toFileMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_toFileMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_toFileMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_toFileMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_toFileMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_toFileMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_filenameMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_filenameMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_filenameMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_filenameMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_filenameMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_filenameMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_toStandardOutputMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_toStandardOutputMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_toStandardOutputMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_toStandardOutputMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_toStandardOutputMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_toStandardOutputMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_logFormatMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_logFormatMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_logFormatMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_logFormatMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_logFormatMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_logFormatMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_subsecondPrecisionMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_subsecondPrecisionMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_subsecondPrecisionMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_subsecondPrecisionMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_subsecondPrecisionMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_subsecondPrecisionMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_performanceTrackingMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_performanceTrackingMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_performanceTrackingMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_performanceTrackingMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_performanceTrackingMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_performanceTrackingMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_fileStreamMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_fileStreamMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_fileStreamMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_fileStreamMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_fileStreamMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->m_fileStreamMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_maxLogFileSizeMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_maxLogFileSizeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_maxLogFileSizeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_maxLogFileSizeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_maxLogFileSizeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_maxLogFileSizeMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_logFlushThresholdMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_logFlushThresholdMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_logFlushThresholdMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_logFlushThresholdMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_logFlushThresholdMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_logFlushThresholdMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  configurations = other->m_configurations;
  this->m_configurations = configurations;
  this->m_logStreamsReference = other->m_logStreamsReference;
  build(this,configurations);
  return;
}

Assistant:

TypedConfigurations::TypedConfigurations(const TypedConfigurations& other) {
  this->m_configurations = other.m_configurations;
  this->m_logStreamsReference = other.m_logStreamsReference;
  build(m_configurations);
}